

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test.cc
# Opt level: O0

TargetBits highwayhash::anon_unknown_0::VerifyCat<unsigned_long>(ThreadPool *pool)

{
  int iVar1;
  anon_class_24_3_133d0391 local_f0;
  atomic<unsigned_int> local_d4;
  ulong uStack_d0;
  atomic<unsigned_int> targets;
  size_t size;
  char flat [105];
  size_t kMaxSize;
  HHKey key;
  ThreadPool *pool_local;
  memory_order __b;
  
  kMaxSize = 0x1f1e1d1c1b1a1918;
  key[0] = 0x1716151413121110;
  key[1] = 0xf0e0d0c0b0a0908;
  key[2] = 0x706050403020100;
  key[3] = (uint64_t)pool;
  srand(0x81);
  for (uStack_d0 = 0; uStack_d0 < 0x69; uStack_d0 = uStack_d0 + 1) {
    iVar1 = rand();
    flat[uStack_d0 - 8] = (char)iVar1;
  }
  local_d4.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0xffffffff;
  local_f0.key = (HHKey *)&kMaxSize;
  local_f0.flat = (char (*) [105])&size;
  local_f0.targets = &local_d4;
  ThreadPool::
  Run<highwayhash::(anonymous_namespace)::VerifyCat<unsigned_long>(highwayhash::ThreadPool*)::_lambda(unsigned_int)_1_>
            ((ThreadPool *)key[3],0,0x69,&local_f0);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (TargetBits)local_d4.super___atomic_base<unsigned_int>._M_i;
}

Assistant:

TargetBits VerifyCat(ThreadPool* pool) {
  // Reversed order vs prior test.
  const HHKey key = {0x1F1E1D1C1B1A1918ULL, 0x1716151413121110ULL,
                     0x0F0E0D0C0B0A0908ULL, 0x0706050403020100ULL};

  const size_t kMaxSize = 3 * 35;
  char flat[kMaxSize];
  srand(129);
  for (size_t size = 0; size < kMaxSize; ++size) {
    flat[size] = static_cast<char>(rand() & 0xFF);
  }

  std::atomic<TargetBits> targets{~0U};

  pool->Run(0, kMaxSize, [&key, &flat, &targets](const uint32_t i) {
    Result dummy;
    targets.fetch_and(InstructionSets::RunAll<HighwayHashCatTest>(
        key, flat, i, &dummy, &OnCatFailure));
  });
  return targets.load();
}